

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ParquetWriteBind
          (duckdb *this,ClientContext *context,CopyFunctionBindInput *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  vector<duckdb::Value,_true> *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  const_reference pvVar5;
  uint64_t uVar6;
  pointer pPVar7;
  idx_t iVar8;
  string *psVar9;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *__x;
  reference this_01;
  string *psVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  int64_t iVar13;
  int64_t iVar14;
  DBConfig *pDVar15;
  BinderException *pBVar16;
  NotImplementedException *this_02;
  ParquetVersion PVar17;
  type tVar18;
  __node_base *p_Var19;
  ulong uVar20;
  double dVar21;
  value_type roption;
  __uniq_ptr_impl<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>_>
  local_138;
  allocator local_129;
  case_insensitive_map_t<LogicalType> name_to_type_map;
  vector<duckdb::Value,_true> values;
  string loption;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  make_uniq<duckdb::ParquetWriteBindData>();
  p_Var19 = &(input->info->options)._M_h._M_before_begin;
  bVar2 = false;
  bVar4 = false;
  bVar3 = false;
  do {
    p_Var19 = p_Var19->_M_nxt;
    if (p_Var19 == (__node_base *)0x0) {
      if ((bVar3) &&
         (pDVar15 = DBConfig::GetConfig(context),
         (pDVar15->options).preserve_insertion_order == true)) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&roption,
                   "ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET preserve_insertion_order=false;\" to disable preserving insertion order."
                   ,(allocator *)&name_to_type_map);
        BinderException::BinderException(pBVar16,(string *)&roption);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if ((bVar4) &&
         (pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 *)&local_138), pPVar7->codec != ZSTD)) {
        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&roption,
                   "Compression level is only supported for the ZSTD compression codec",
                   (allocator *)&name_to_type_map);
        BinderException::BinderException(pBVar16,(string *)&roption);
        __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             *)&local_138);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
                (&(pPVar7->sql_types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                 &sql_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                );
      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             *)&local_138);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&pPVar7->column_names,
                  &names->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
      *(tuple<duckdb::ParquetWriteBindData_*,_std::default_delete<duckdb::ParquetWriteBindData>_> *)
       this = local_138._M_t.
              super__Tuple_impl<0UL,_duckdb::ParquetWriteBindData_*,_std::default_delete<duckdb::ParquetWriteBindData>_>
              .super__Head_base<0UL,_duckdb::ParquetWriteBindData_*,_false>._M_head_impl;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    StringUtil::Lower((string *)&loption,(string *)(p_Var19 + 1));
    if ((long)p_Var19[6]._M_nxt - (long)p_Var19[5]._M_nxt != 0x40) {
      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&roption,"%s requires exactly one argument",
                 (allocator *)&name_to_type_map);
      StringUtil::Upper(&local_50,(string *)&loption);
      BinderException::BinderException<std::__cxx11::string>
                (pBVar16,(string *)&roption,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_00 = (vector<duckdb::Value,_true> *)(p_Var19 + 5);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &loption,"row_group_size");
    if ((bVar1) ||
       (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&loption,"chunk_size"), bVar1)) {
      pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
      uVar6 = Value::GetValue<unsigned_long>(pvVar5);
      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             *)&local_138);
      pPVar7->row_group_size = uVar6;
      if (bVar2) {
LAB_01ea49b6:
        bVar2 = true;
      }
      else {
        pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               *)&local_138);
        bVar2 = false;
        pPVar7->dictionary_size_limit = pPVar7->row_group_size / 0x14;
      }
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&loption,"row_group_size_bytes");
      if (bVar1) {
        pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
        Value::Value(&roption,pvVar5);
        if (roption.type_.id_ == VARCHAR) {
          Value::ToString_abi_cxx11_((string *)&name_to_type_map,&roption);
          iVar8 = DBConfig::ParseMemoryLimit((string *)&name_to_type_map);
          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 *)&local_138);
          pPVar7->row_group_size_bytes = iVar8;
          ::std::__cxx11::string::~string((string *)&name_to_type_map);
        }
        else {
          pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
          uVar6 = Value::GetValue<unsigned_long>(pvVar5);
          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 *)&local_138);
          pPVar7->row_group_size_bytes = uVar6;
        }
        Value::~Value(&roption);
        bVar3 = true;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&loption,"row_groups_per_file");
        if (bVar1) {
          pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
          uVar6 = Value::GetValue<unsigned_long>(pvVar5);
          optional_idx::optional_idx((optional_idx *)&roption,uVar6);
          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                 *)&local_138);
          (pPVar7->row_groups_per_file).index = roption.type_._0_8_;
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&loption,"compression");
          if ((bVar1) ||
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&loption,"codec"), bVar1)) {
            pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
            Value::ToString_abi_cxx11_((string *)&name_to_type_map,pvVar5);
            StringUtil::Lower((string *)&roption,(string *)&name_to_type_map);
            ::std::__cxx11::string::~string((string *)&name_to_type_map);
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&roption,"uncompressed");
            if (bVar1) {
              pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                       ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                     *)&local_138);
              tVar18 = UNCOMPRESSED;
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&roption,"snappy");
              if (bVar1) {
                pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       *)&local_138);
                tVar18 = SNAPPY;
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&roption,"gzip");
                if (bVar1) {
                  pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                         *)&local_138);
                  tVar18 = GZIP;
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&roption,"zstd");
                  if (bVar1) {
                    pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                           *)&local_138);
                    tVar18 = ZSTD;
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&roption,"brotli");
                    if (bVar1) {
                      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                             *)&local_138);
                      tVar18 = BROTLI;
                    }
                    else {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&roption,"lz4");
                      if ((!bVar1) &&
                         (bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&roption,"lz4_raw"), !bVar1)) {
                        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                        ::std::__cxx11::string::string
                                  ((string *)&name_to_type_map,
                                   "Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]"
                                   ,(allocator *)&values);
                        ::std::__cxx11::string::string((string *)&local_70,(string *)&loption);
                        BinderException::BinderException<std::__cxx11::string>
                                  (pBVar16,(string *)&name_to_type_map,&local_70);
                        __cxa_throw(pBVar16,&BinderException::typeinfo,
                                    ::std::runtime_error::~runtime_error);
                      }
                      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                             *)&local_138);
                      tVar18 = LZ4_RAW;
                    }
                  }
                }
              }
            }
            pPVar7->codec = tVar18;
            goto LAB_01ea4fa1;
          }
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&loption,"field_ids");
          if (bVar1) {
            pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
            if ((pvVar5->type_).id_ == VARCHAR) {
              pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
              psVar9 = StringValue::Get_abi_cxx11_(pvVar5);
              StringUtil::Lower((string *)&roption,(string *)psVar9);
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&roption,"auto");
              ::std::__cxx11::string::~string((string *)&roption);
              if (bVar1) {
                roption.type_.id_ = INVALID;
                roption.type_.physical_type_ = ~INVALID;
                roption.type_._2_6_ = 0;
                pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       *)&local_138);
                GenerateFieldIDs(&pPVar7->field_ids,(idx_t *)&roption,names,sql_types);
                goto LAB_01ea4fa9;
              }
            }
            roption.type_._0_8_ = &roption.value_info_;
            roption.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x1;
            roption.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            roption.is_null = false;
            roption._25_7_ = 0;
            roption.value_.integer = 0x3f800000;
            roption.value_.hugeint.upper = 0;
            roption.value_info_.internal.
            super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            name_to_type_map._M_h._M_buckets = &name_to_type_map._M_h._M_single_bucket;
            name_to_type_map._M_h._M_bucket_count = 1;
            name_to_type_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            name_to_type_map._M_h._M_element_count = 0;
            name_to_type_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            name_to_type_map._M_h._M_rehash_policy._M_next_resize = 0;
            name_to_type_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
            for (uVar20 = 0;
                uVar20 < (ulong)((long)(names->
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(names->
                                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar20 = uVar20 + 1) {
              pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>(names,uVar20);
              bVar1 = ::std::operator==(pvVar11,"__duckdb_field_id");
              if (bVar1) {
                pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&values,
                           "Cannot have a column named \"%s\" when writing FIELD_IDS",&local_129);
                BinderException::BinderException<char_const*>
                          (pBVar16,(string *)&values,"__duckdb_field_id");
                __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ::get<true>(names,uVar20);
              pvVar12 = vector<duckdb::LogicalType,_true>::get<true>(sql_types,uVar20);
              ::std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string_const&,duckdb::LogicalType_const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&name_to_type_map,pvVar11,pvVar12);
            }
            pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
            pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                     ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   *)&local_138);
            GetFieldIDs(pvVar5,&pPVar7->field_ids,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&roption,&name_to_type_map);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(&name_to_type_map._M_h);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&roption);
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&loption,"kv_metadata");
            if (bVar1) {
              pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
              if ((pvVar5->type_).id_ != STRUCT) {
                pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&roption,"Expected kv_metadata argument to be a STRUCT",
                           (allocator *)&name_to_type_map);
                BinderException::BinderException(pBVar16,(string *)&roption);
                __cxa_throw(pBVar16,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              __x = &StructValue::GetChildren(pvVar5)->
                     super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>;
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values,__x);
              for (uVar20 = 0;
                  uVar20 < (ulong)((long)values.
                                         super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                         .
                                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)values.
                                         super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>
                                         .
                                         super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 6);
                  uVar20 = uVar20 + 1) {
                this_01 = vector<duckdb::Value,_true>::get<true>(&values,uVar20);
                psVar10 = StructType::GetChildName_abi_cxx11_(&pvVar5->type_,uVar20);
                ::std::__cxx11::string::string((string *)&roption,(string *)psVar10);
                if ((this_01->type_).id_ == BLOB) {
                  pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                         *)&local_138);
                  psVar9 = StringValue::Get_abi_cxx11_(this_01);
                  ::std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&pPVar7->kv_metadata,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &roption,psVar9);
                }
                else {
                  pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                           ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                         *)&local_138);
                  Value::ToString_abi_cxx11_((string *)&name_to_type_map,this_01);
                  ::std::
                  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  ::emplace_back<std::__cxx11::string&,std::__cxx11::string>
                            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                              *)&pPVar7->kv_metadata,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &roption,(string *)&name_to_type_map);
                  ::std::__cxx11::string::~string((string *)&name_to_type_map);
                }
                ::std::__cxx11::string::~string((string *)&roption);
              }
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&values);
            }
            else {
              bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&loption,"encryption_config");
              if (bVar1) {
                pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                ParquetEncryptionConfig::Create((ParquetEncryptionConfig *)&roption,context,pvVar5);
                pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                         ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                       *)&local_138);
                shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=
                          (&pPVar7->encryption_config,
                           (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)&roption);
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&roption.type_.type_info_);
              }
              else {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&loption,"dictionary_compression_ratio_threshold");
                if (!bVar1) {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&loption,"dictionary_size_limit");
                  if (bVar1) {
                    pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                    iVar8 = Value::GetValue<long>(pvVar5);
                    if ((long)iVar8 < 0) {
                      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::string::string
                                ((string *)&roption,
                                 "dictionary_size_limit must be greater than 0 or 0 to disable",
                                 (allocator *)&name_to_type_map);
                      BinderException::BinderException(pBVar16,(string *)&roption);
                      __cxa_throw(pBVar16,&BinderException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                           *)&local_138);
                    pPVar7->dictionary_size_limit = iVar8;
                    goto LAB_01ea49b6;
                  }
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&loption,"string_dictionary_page_size_limit");
                  if (bVar1) {
                    pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                    uVar6 = Value::GetValue<unsigned_long>(pvVar5);
                    if (uVar6 - 0x40000001 < 0xffffffffc0000000) {
                      pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                      ::std::__cxx11::string::string
                                ((string *)&roption,
                                 "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu"
                                 ,(allocator *)&name_to_type_map);
                      BinderException::BinderException<unsigned_long>
                                (pBVar16,(string *)&roption,0x40000000);
                      __cxa_throw(pBVar16,&BinderException::typeinfo,
                                  ::std::runtime_error::~runtime_error);
                    }
                    pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                             ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                           *)&local_138);
                    pPVar7->string_dictionary_page_size_limit = uVar6;
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&loption,"bloom_filter_false_positive_ratio");
                    if (bVar1) {
                      pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                      dVar21 = Value::GetValue<double>(pvVar5);
                      if (dVar21 <= 0.0) {
                        pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                        ::std::__cxx11::string::string
                                  ((string *)&roption,
                                   "bloom_filter_false_positive_ratio must be greater than 0",
                                   (allocator *)&name_to_type_map);
                        BinderException::BinderException(pBVar16,(string *)&roption);
                        __cxa_throw(pBVar16,&BinderException::typeinfo,
                                    ::std::runtime_error::~runtime_error);
                      }
                      pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                               ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                             *)&local_138);
                      pPVar7->bloom_filter_false_positive_ratio = dVar21;
                    }
                    else {
                      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&loption,"debug_use_openssl");
                      if (bVar1) {
                        pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                        Value::GetValue<std::__cxx11::string>((string *)&name_to_type_map,pvVar5);
                        StringUtil::Lower((string *)&roption,(string *)&name_to_type_map);
                        ::std::__cxx11::string::~string((string *)&name_to_type_map);
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&roption,"false");
                        if (bVar1) {
                          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                 *)&local_138);
                          bVar1 = false;
                        }
                        else {
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&roption,"true");
                          if (!bVar1) {
                            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                            ::std::__cxx11::string::string
                                      ((string *)&name_to_type_map,
                                       "Expected debug_use_openssl to be a BOOLEAN",
                                       (allocator *)&values);
                            BinderException::BinderException(pBVar16,(string *)&name_to_type_map);
                            __cxa_throw(pBVar16,&BinderException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                 *)&local_138);
                          bVar1 = true;
                        }
                        pPVar7->debug_use_openssl = bVar1;
                      }
                      else {
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&loption,"compression_level");
                        if (bVar1) {
                          pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                          iVar13 = Value::GetValue<long>(pvVar5);
                          iVar14 = ZStdFileSystem::MinimumCompressionLevel();
                          if ((iVar13 < iVar14) ||
                             (iVar14 = ZStdFileSystem::MaximumCompressionLevel(), iVar14 < iVar13))
                          {
                            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                            ::std::__cxx11::string::string
                                      ((string *)&roption,
                                       "Compression level must be between %lld and %lld",
                                       (allocator *)&name_to_type_map);
                            iVar13 = ZStdFileSystem::MinimumCompressionLevel();
                            iVar14 = ZStdFileSystem::MaximumCompressionLevel();
                            BinderException::BinderException<long,long>
                                      (pBVar16,(string *)&roption,iVar13,iVar14);
                            __cxa_throw(pBVar16,&BinderException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                 *)&local_138);
                          pPVar7->compression_level = iVar13;
                          bVar4 = true;
                          goto LAB_01ea4fa9;
                        }
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&loption,"parquet_version");
                        if (!bVar1) {
                          this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
                          ::std::__cxx11::string::string
                                    ((string *)&roption,"Unrecognized option for PARQUET: %s",
                                     (allocator *)&name_to_type_map);
                          NotImplementedException::NotImplementedException<char_const*>
                                    (this_02,(string *)&roption,
                                     (((string *)(p_Var19 + 1))->_M_dataplus)._M_p);
                          __cxa_throw(this_02,&NotImplementedException::typeinfo,
                                      ::std::runtime_error::~runtime_error);
                        }
                        pvVar5 = vector<duckdb::Value,_true>::get<true>(this_00,0);
                        Value::ToString_abi_cxx11_((string *)&name_to_type_map,pvVar5);
                        StringUtil::Upper((string *)&roption,(string *)&name_to_type_map);
                        ::std::__cxx11::string::~string((string *)&name_to_type_map);
                        bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&roption,"V1");
                        if (bVar1) {
                          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                 *)&local_138);
                          PVar17 = V1;
                        }
                        else {
                          bVar1 = ::std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&roption,"V2");
                          if (!bVar1) {
                            pBVar16 = (BinderException *)__cxa_allocate_exception(0x10);
                            ::std::__cxx11::string::string
                                      ((string *)&name_to_type_map,
                                       "Expected parquet_version \'V1\' or \'V2\'",
                                       (allocator *)&values);
                            BinderException::BinderException(pBVar16,(string *)&name_to_type_map);
                            __cxa_throw(pBVar16,&BinderException::typeinfo,
                                        ::std::runtime_error::~runtime_error);
                          }
                          pPVar7 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                   ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                 *)&local_138);
                          PVar17 = V2;
                        }
                        pPVar7->parquet_version = PVar17;
                      }
LAB_01ea4fa1:
                      ::std::__cxx11::string::~string((string *)&roption);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_01ea4fa9:
    ::std::__cxx11::string::~string((string *)&loption);
  } while( true );
}

Assistant:

unique_ptr<FunctionData> ParquetWriteBind(ClientContext &context, CopyFunctionBindInput &input,
                                          const vector<string> &names, const vector<LogicalType> &sql_types) {
	D_ASSERT(names.size() == sql_types.size());
	bool row_group_size_bytes_set = false;
	bool compression_level_set = false;
	bool dictionary_size_limit_set = false;
	auto bind_data = make_uniq<ParquetWriteBindData>();
	for (auto &option : input.info.options) {
		const auto loption = StringUtil::Lower(option.first);
		if (option.second.size() != 1) {
			// All parquet write options require exactly one argument
			throw BinderException("%s requires exactly one argument", StringUtil::Upper(loption));
		}
		if (loption == "row_group_size" || loption == "chunk_size") {
			bind_data->row_group_size = option.second[0].GetValue<uint64_t>();
			if (!dictionary_size_limit_set) {
				bind_data->SetToDefaultDictionarySizeLimit();
			}
		} else if (loption == "row_group_size_bytes") {
			auto roption = option.second[0];
			if (roption.GetTypeMutable().id() == LogicalTypeId::VARCHAR) {
				bind_data->row_group_size_bytes = DBConfig::ParseMemoryLimit(roption.ToString());
			} else {
				bind_data->row_group_size_bytes = option.second[0].GetValue<uint64_t>();
			}
			row_group_size_bytes_set = true;
		} else if (loption == "row_groups_per_file") {
			bind_data->row_groups_per_file = option.second[0].GetValue<uint64_t>();
		} else if (loption == "compression" || loption == "codec") {
			const auto roption = StringUtil::Lower(option.second[0].ToString());
			if (roption == "uncompressed") {
				bind_data->codec = duckdb_parquet::CompressionCodec::UNCOMPRESSED;
			} else if (roption == "snappy") {
				bind_data->codec = duckdb_parquet::CompressionCodec::SNAPPY;
			} else if (roption == "gzip") {
				bind_data->codec = duckdb_parquet::CompressionCodec::GZIP;
			} else if (roption == "zstd") {
				bind_data->codec = duckdb_parquet::CompressionCodec::ZSTD;
			} else if (roption == "brotli") {
				bind_data->codec = duckdb_parquet::CompressionCodec::BROTLI;
			} else if (roption == "lz4" || roption == "lz4_raw") {
				/* LZ4 is technically another compression scheme, but deprecated and arrow also uses them
				 * interchangeably */
				bind_data->codec = duckdb_parquet::CompressionCodec::LZ4_RAW;
			} else {
				throw BinderException("Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]",
				                      loption);
			}
		} else if (loption == "field_ids") {
			if (option.second[0].type().id() == LogicalTypeId::VARCHAR &&
			    StringUtil::Lower(StringValue::Get(option.second[0])) == "auto") {
				idx_t field_id = 0;
				GenerateFieldIDs(bind_data->field_ids, field_id, names, sql_types);
			} else {
				unordered_set<uint32_t> unique_field_ids;
				case_insensitive_map_t<LogicalType> name_to_type_map;
				for (idx_t col_idx = 0; col_idx < names.size(); col_idx++) {
					if (names[col_idx] == FieldID::DUCKDB_FIELD_ID) {
						throw BinderException("Cannot have a column named \"%s\" when writing FIELD_IDS",
						                      FieldID::DUCKDB_FIELD_ID);
					}
					name_to_type_map.emplace(names[col_idx], sql_types[col_idx]);
				}
				GetFieldIDs(option.second[0], bind_data->field_ids, unique_field_ids, name_to_type_map);
			}
		} else if (loption == "kv_metadata") {
			auto &kv_struct = option.second[0];
			auto &kv_struct_type = kv_struct.type();
			if (kv_struct_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Expected kv_metadata argument to be a STRUCT");
			}
			auto values = StructValue::GetChildren(kv_struct);
			for (idx_t i = 0; i < values.size(); i++) {
				auto &value = values[i];
				auto key = StructType::GetChildName(kv_struct_type, i);
				// If the value is a blob, write the raw blob bytes
				// otherwise, cast to string
				if (value.type().id() == LogicalTypeId::BLOB) {
					bind_data->kv_metadata.emplace_back(key, StringValue::Get(value));
				} else {
					bind_data->kv_metadata.emplace_back(key, value.ToString());
				}
			}
		} else if (loption == "encryption_config") {
			bind_data->encryption_config = ParquetEncryptionConfig::Create(context, option.second[0]);
		} else if (loption == "dictionary_compression_ratio_threshold") {
			// deprecated, ignore setting
		} else if (loption == "dictionary_size_limit") {
			auto val = option.second[0].GetValue<int64_t>();
			if (val < 0) {
				throw BinderException("dictionary_size_limit must be greater than 0 or 0 to disable");
			}
			bind_data->dictionary_size_limit = val;
			dictionary_size_limit_set = true;
		} else if (loption == "string_dictionary_page_size_limit") {
			auto val = option.second[0].GetValue<uint64_t>();
			if (val > PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE || val == 0) {
				throw BinderException(
				    "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu",
				    PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE);
			}
			bind_data->string_dictionary_page_size_limit = val;
		} else if (loption == "bloom_filter_false_positive_ratio") {
			auto val = option.second[0].GetValue<double>();
			if (val <= 0) {
				throw BinderException("bloom_filter_false_positive_ratio must be greater than 0");
			}
			bind_data->bloom_filter_false_positive_ratio = val;
		} else if (loption == "debug_use_openssl") {
			auto val = StringUtil::Lower(option.second[0].GetValue<std::string>());
			if (val == "false") {
				bind_data->debug_use_openssl = false;
			} else if (val == "true") {
				bind_data->debug_use_openssl = true;
			} else {
				throw BinderException("Expected debug_use_openssl to be a BOOLEAN");
			}
		} else if (loption == "compression_level") {
			const auto val = option.second[0].GetValue<int64_t>();
			if (val < ZStdFileSystem::MinimumCompressionLevel() || val > ZStdFileSystem::MaximumCompressionLevel()) {
				throw BinderException("Compression level must be between %lld and %lld",
				                      ZStdFileSystem::MinimumCompressionLevel(),
				                      ZStdFileSystem::MaximumCompressionLevel());
			}
			bind_data->compression_level = val;
			compression_level_set = true;
		} else if (loption == "parquet_version") {
			const auto roption = StringUtil::Upper(option.second[0].ToString());
			if (roption == "V1") {
				bind_data->parquet_version = ParquetVersion::V1;
			} else if (roption == "V2") {
				bind_data->parquet_version = ParquetVersion::V2;
			} else {
				throw BinderException("Expected parquet_version 'V1' or 'V2'");
			}
		} else {
			throw NotImplementedException("Unrecognized option for PARQUET: %s", option.first.c_str());
		}
	}
	if (row_group_size_bytes_set) {
		if (DBConfig::GetConfig(context).options.preserve_insertion_order) {
			throw BinderException("ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET "
			                      "preserve_insertion_order=false;\" to disable preserving insertion order.");
		}
	}

	if (compression_level_set && bind_data->codec != CompressionCodec::ZSTD) {
		throw BinderException("Compression level is only supported for the ZSTD compression codec");
	}

	bind_data->sql_types = sql_types;
	bind_data->column_names = names;
	return std::move(bind_data);
}